

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_af1b6::CpuAbsoluteTest_and_abs_sets_zero_clears_neg_Test::
~CpuAbsoluteTest_and_abs_sets_zero_clears_neg_Test
          (CpuAbsoluteTest_and_abs_sets_zero_clears_neg_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteTest, and_abs_sets_zero_clears_neg) {
    registers.a = 0b10101010;
    registers.p = N_FLAG;
    expected.a = 0b00000000;
    expected.p = Z_FLAG;
    memory_content = 0b01010101;

    run_read_instruction(AND_ABS);
}